

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

bool __thiscall Assimp::D3MF::D3MFExporter::exportRelations(D3MFExporter *this)

{
  ostringstream *poVar1;
  OpcPackageRelationship *pOVar2;
  char cVar3;
  pointer ppOVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  string local_70;
  string local_50;
  
  poVar1 = &this->mRelOutput;
  std::ios::clear((int)*(undefined8 *)(*(long *)&this->mRelOutput + -0x18) + (int)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>",0x26);
  cVar3 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->mRelOutput + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "<Relationships xmlns=\"http://schemas.openxmlformats.org/package/2006/relationships\">"
             ,0x54);
  ppOVar4 = (this->mRelations).
            super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mRelations).
      super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppOVar4) {
    uVar8 = 0;
    do {
      if (*(ppOVar4[uVar8]->target)._M_dataplus._M_p == '/') {
        lVar6 = 0x16;
        pcVar7 = "<Relationship Target=\"";
      }
      else {
        lVar6 = 0x17;
        pcVar7 = "<Relationship Target=\"/";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar7,lVar6);
      pOVar2 = (this->mRelations).
               super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8];
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(pOVar2->target)._M_dataplus._M_p,
                          (pOVar2->target)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Id=\"",4);
      pOVar2 = (this->mRelations).
               super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8];
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(pOVar2->id)._M_dataplus._M_p,
                          (pOVar2->id)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Type=\"",6);
      pOVar2 = (this->mRelations).
               super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8];
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(pOVar2->type)._M_dataplus._M_p,
                          (pOVar2->type)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" />",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)&this->mRelOutput + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      uVar8 = uVar8 + 1;
      ppOVar4 = (this->mRelations).
                super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->mRelations).
                                   super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar4 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</Relationships>",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_rels","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".rels","");
  writeRelInfoToFile(this,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::ostream::flush();
  return true;
}

Assistant:

bool D3MFExporter::exportRelations() {
    mRelOutput.clear();

    mRelOutput << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>";
    mRelOutput << std::endl;
    mRelOutput << "<Relationships xmlns=\"http://schemas.openxmlformats.org/package/2006/relationships\">";

    for ( size_t i = 0; i < mRelations.size(); ++i ) {
        if ( mRelations[ i ]->target[ 0 ] == '/' ) {
            mRelOutput << "<Relationship Target=\"" << mRelations[ i ]->target << "\" ";
        } else {
            mRelOutput << "<Relationship Target=\"/" << mRelations[ i ]->target << "\" ";
        }
        mRelOutput << "Id=\"" << mRelations[i]->id << "\" ";
        mRelOutput << "Type=\"" << mRelations[ i ]->type << "\" />";
        mRelOutput << std::endl;
    }
    mRelOutput << "</Relationships>";
    mRelOutput << std::endl;

    writeRelInfoToFile( "_rels", ".rels" );
    mRelOutput.flush();

    return true;
}